

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

FString __thiscall FOptionMenuTextField::Represent(FOptionMenuTextField *this)

{
  long *plVar1;
  BYTE *copyStr;
  long in_RSI;
  
  if (*(char *)(in_RSI + 0x38) == '\x01') {
    copyStr = (BYTE *)(in_RSI + 0x39);
  }
  else {
    plVar1 = *(long **)(in_RSI + 0x28);
    if (plVar1 == (long *)0x0) {
      copyStr = "";
    }
    else {
      copyStr = (BYTE *)(**(code **)(*plVar1 + 0x18))(plVar1,0xffffffff);
    }
  }
  FString::FString((FString *)this,(char *)copyStr);
  if (*(char *)(in_RSI + 0x38) == '\x01') {
    FString::operator+=((FString *)this,
                        (((undefined1)gameinfo.gametype & GAME_DoomStrifeChex) != GAME_Any) * '\x04'
                        + '[');
  }
  return (FString)(char *)this;
}

Assistant:

FString Represent()
	{
		FString text = mEntering ? mEditName : GetCVarString();

		if ( mEntering )
			text += ( gameinfo.gametype & GAME_DoomStrifeChex ) ? '_' : '[';

		return text;
	}